

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O0

void mpmc_pointer_basics<int*,10ul>(void)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  byte extraout_AL_05;
  byte extraout_AL_06;
  byte extraout_AL_07;
  byte extraout_AL_08;
  byte extraout_AL_09;
  byte extraout_AL_10;
  byte extraout_AL_11;
  byte extraout_AL_12;
  int *data_00;
  Expression_lhs<const_bool> this;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  Expression_lhs<const_unsigned_long> EVar2;
  Expression_lhs<int_*const> EVar3;
  ResultBuilder DOCTEST_RB_13;
  ResultBuilder DOCTEST_RB_12;
  ResultBuilder DOCTEST_RB_11;
  ResultBuilder DOCTEST_RB_10;
  size_t i_3;
  ResultBuilder DOCTEST_RB_9;
  size_t i_2;
  ResultBuilder DOCTEST_RB_8;
  ResultBuilder DOCTEST_RB_7;
  ResultBuilder DOCTEST_RB_6;
  size_t i_1;
  ResultBuilder DOCTEST_RB_5;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  size_t i;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> data;
  size_t N;
  MPMC<int_*,_10UL> mpmc;
  Result *pRVar4;
  ResultBuilder *in_stack_ffffffffffffb208;
  undefined4 in_stack_ffffffffffffb210;
  int in_stack_ffffffffffffb214;
  allocator_type *in_stack_ffffffffffffb218;
  undefined4 in_stack_ffffffffffffb220;
  Enum in_stack_ffffffffffffb224;
  ResultBuilder *in_stack_ffffffffffffb228;
  MPMC<int_*,_10UL> *in_stack_ffffffffffffb238;
  MPMC<int_*,_10UL> *in_stack_ffffffffffffb248;
  undefined7 in_stack_ffffffffffffb288;
  undefined1 in_stack_ffffffffffffb28f;
  byte bVar5;
  Expression_lhs<int_*const> *in_stack_ffffffffffffb290;
  MPMC<int_*,_10UL> *this_00;
  MPMC<int_*,_10UL> *in_stack_ffffffffffffb390;
  ExpressionDecomposer local_4c4c;
  int *local_4c48;
  Enum local_4c40;
  ResultBuilder local_4c18;
  undefined1 local_4b9e;
  undefined1 local_4b9d;
  ExpressionDecomposer local_4b9c;
  Expression_lhs<const_bool> local_4b98;
  ResultBuilder local_4b70;
  reference local_4af8;
  int *local_4af0;
  Enum local_4ae8;
  int *local_4ae0;
  ExpressionDecomposer local_4ad4;
  int *local_4ad0;
  Enum local_4ac8;
  ResultBuilder local_4aa0;
  undefined1 local_4a26;
  undefined1 local_4a25;
  ExpressionDecomposer local_4a24;
  Expression_lhs<const_bool> local_4a20;
  ResultBuilder local_49f8;
  ulong local_4980;
  undefined1 local_4976;
  undefined1 local_4975;
  ExpressionDecomposer local_4974;
  Expression_lhs<const_bool> local_4970;
  ResultBuilder local_4948;
  size_type local_48d0;
  undefined8 local_48c8;
  int *local_48c0;
  Enum local_48b8;
  int *local_48b0;
  ExpressionDecomposer local_48a4;
  int *local_48a0;
  Enum local_4898;
  ResultBuilder local_4870;
  undefined1 local_47f6;
  undefined1 local_47f5;
  ExpressionDecomposer local_47f4;
  Expression_lhs<const_bool> local_47f0;
  ResultBuilder local_47c8;
  reference local_4750;
  int *local_4748;
  Enum local_4740;
  int *local_4738;
  ExpressionDecomposer local_472c;
  int *local_4728;
  Enum local_4720;
  ResultBuilder local_46f8;
  ulong local_4680;
  undefined1 local_4676;
  undefined1 local_4675;
  ExpressionDecomposer local_4674;
  Expression_lhs<const_bool> local_4670;
  ResultBuilder local_4648;
  undefined1 local_45ce;
  undefined1 local_45cd;
  ExpressionDecomposer local_45cc;
  Expression_lhs<const_bool> local_45c8;
  ResultBuilder local_45a0;
  undefined1 local_4526;
  undefined1 local_4525;
  ExpressionDecomposer local_4524;
  Expression_lhs<const_bool> local_4520;
  ResultBuilder local_44f8;
  ulong local_4480;
  undefined8 local_4478;
  int *local_4470;
  Enum local_4468;
  int *local_4460;
  ExpressionDecomposer local_4454;
  int *local_4450;
  Enum local_4448;
  ResultBuilder local_4420;
  undefined1 local_43a6;
  undefined1 local_43a5;
  ExpressionDecomposer local_43a4;
  Expression_lhs<const_bool> local_43a0;
  ResultBuilder local_4378;
  unsigned_long local_4300;
  Enum local_42f8;
  size_t local_42f0;
  ExpressionDecomposer local_42e4;
  unsigned_long local_42e0;
  Enum local_42d8;
  ResultBuilder local_42b0;
  undefined1 local_4221 [25];
  ulong local_4208;
  MPMC<int_*,_10UL> local_4200;
  
  tf::MPMC<int_*,_10UL>::MPMC(in_stack_ffffffffffffb248);
  local_4208 = 0x400;
  data_00 = (int *)0x401;
  this_00 = (MPMC<int_*,_10UL> *)local_4221;
  std::allocator<int>::allocator((allocator<int> *)0x1be020);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb228,
             CONCAT44(in_stack_ffffffffffffb224,in_stack_ffffffffffffb220),in_stack_ffffffffffffb218
            );
  std::allocator<int>::~allocator((allocator<int> *)0x1be04c);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218,
             in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
             (char *)in_stack_ffffffffffffb238);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_42e4,DT_REQUIRE);
  local_42f0 = tf::MPMC<int_*,_10UL>::capacity(&local_4200);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(unsigned_long *)pRVar4);
  local_4300 = EVar2.lhs;
  local_42f8 = EVar2.m_at;
  local_42e0 = local_4300;
  local_42d8 = local_42f8;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            ((Expression_lhs<const_unsigned_long> *)in_stack_ffffffffffffb290,
             (unsigned_long *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
  doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1be160);
  doctest::detail::ResultBuilder::log(&local_42b0,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1be27b);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218,
             in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
             (char *)in_stack_ffffffffffffb238);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_43a4,DT_REQUIRE);
  local_43a5 = tf::MPMC<int_*,_10UL>::empty(in_stack_ffffffffffffb238);
  local_43a0 = doctest::detail::ExpressionDecomposer::operator<<
                         ((ExpressionDecomposer *)
                          CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                          (bool *)in_stack_ffffffffffffb208);
  local_43a6 = 1;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
             (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
  doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1be367);
  doctest::detail::ResultBuilder::log(&local_4378,__x_00);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1be452);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218,
             in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
             (char *)in_stack_ffffffffffffb238);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4454,DT_REQUIRE);
  local_4460 = tf::MPMC<int_*,_10UL>::try_dequeue(this_00);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(int **)pRVar4);
  local_4470 = EVar3.lhs;
  local_4468 = EVar3.m_at;
  local_4478 = 0;
  local_4450 = local_4470;
  local_4448 = local_4468;
  doctest::detail::Expression_lhs<int*const>::operator==
            (in_stack_ffffffffffffb290,
             (void **)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
  doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1be576);
  doctest::detail::ResultBuilder::log(&local_4420,__x_01);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1be661);
  for (local_4480 = 0; local_4480 < local_4208; local_4480 = local_4480 + 1) {
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218
               ,in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
               (char *)in_stack_ffffffffffffb238);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4524,DT_REQUIRE);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_4480);
    local_4525 = tf::MPMC<int_*,_10UL>::try_enqueue(this_00,data_00);
    local_4520 = doctest::detail::ExpressionDecomposer::operator<<
                           ((ExpressionDecomposer *)
                            CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                            (bool *)in_stack_ffffffffffffb208);
    local_4526 = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
               (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
    doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1be787);
    doctest::detail::ResultBuilder::log(&local_44f8,__x_02);
    if ((extraout_AL_02 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1be86c);
  }
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218,
             in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
             (char *)in_stack_ffffffffffffb238);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_45cc,DT_REQUIRE);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_4208);
  local_45cd = tf::MPMC<int_*,_10UL>::try_enqueue(this_00,data_00);
  local_45c8 = doctest::detail::ExpressionDecomposer::operator<<
                         ((ExpressionDecomposer *)
                          CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                          (bool *)in_stack_ffffffffffffb208);
  local_45ce = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
             (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
  doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1be99d);
  doctest::detail::ResultBuilder::log(&local_45a0,__x_03);
  if ((extraout_AL_03 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bea76);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218,
             in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
             (char *)in_stack_ffffffffffffb238);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4674,DT_REQUIRE);
  local_4675 = tf::MPMC<int_*,_10UL>::empty(in_stack_ffffffffffffb238);
  local_4670 = doctest::detail::ExpressionDecomposer::operator<<
                         ((ExpressionDecomposer *)
                          CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                          (bool *)in_stack_ffffffffffffb208);
  local_4676 = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
             (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
  doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1beb62);
  doctest::detail::ResultBuilder::log(&local_4648,__x_04);
  if ((extraout_AL_04 & 1) == 0) {
    doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bec4d);
    for (local_4680 = 0; local_4680 < local_4208; local_4680 = local_4680 + 1) {
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                 (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                 (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_472c,DT_REQUIRE);
      local_4738 = tf::MPMC<int_*,_10UL>::try_dequeue(this_00);
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(int **)pRVar4);
      local_4748 = EVar3.lhs;
      local_4740 = EVar3.m_at;
      local_4728 = local_4748;
      local_4720 = local_4740;
      local_4750 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_4680);
      doctest::detail::Expression_lhs<int*const>::operator==
                (in_stack_ffffffffffffb290,
                 (int **)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
      doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
      doctest::detail::Result::~Result((Result *)0x1beda4);
      doctest::detail::ResultBuilder::log(&local_46f8,__x_05);
      if ((extraout_AL_05 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bee89);
    }
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218
               ,in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
               (char *)in_stack_ffffffffffffb238);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_47f4,DT_REQUIRE);
    local_47f5 = tf::MPMC<int_*,_10UL>::empty(in_stack_ffffffffffffb238);
    local_47f0 = doctest::detail::ExpressionDecomposer::operator<<
                           ((ExpressionDecomposer *)
                            CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                            (bool *)in_stack_ffffffffffffb208);
    local_47f6 = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
               (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
    doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1befa2);
    doctest::detail::ResultBuilder::log(&local_47c8,__x_06);
    if ((extraout_AL_06 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bf07b);
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,(char *)in_stack_ffffffffffffb218
               ,in_stack_ffffffffffffb214,(char *)in_stack_ffffffffffffb208,"",
               (char *)in_stack_ffffffffffffb238);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_48a4,DT_REQUIRE);
    local_48b0 = tf::MPMC<int_*,_10UL>::try_dequeue(this_00);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(int **)pRVar4);
    local_48c0 = EVar3.lhs;
    local_48b8 = EVar3.m_at;
    local_48c8 = 0;
    local_48a0 = local_48c0;
    local_4898 = local_48b8;
    doctest::detail::Expression_lhs<int*const>::operator==
              (in_stack_ffffffffffffb290,
               (void **)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
    doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1bf19f);
    doctest::detail::ResultBuilder::log(&local_4870,__x_07);
    if ((extraout_AL_07 & 1) == 0) {
      doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bf284);
      for (local_48d0 = 0; local_48d0 < local_4208; local_48d0 = local_48d0 + 1) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_48d0);
        tf::MPMC<int_*,_10UL>::enqueue(in_stack_ffffffffffffb390,(int *)this_00);
      }
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                 (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                 (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4974,DT_REQUIRE);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_4208);
      local_4975 = tf::MPMC<int_*,_10UL>::try_enqueue(this_00,data_00);
      local_4970 = doctest::detail::ExpressionDecomposer::operator<<
                             ((ExpressionDecomposer *)
                              CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                              (bool *)in_stack_ffffffffffffb208);
      local_4976 = 0;
      doctest::detail::Expression_lhs<bool_const>::operator==
                ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
                 (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
      doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
      doctest::detail::Result::~Result((Result *)0x1bf3f7);
      doctest::detail::ResultBuilder::log(&local_4948,__x_08);
      if ((extraout_AL_08 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bf4d0);
      local_4980 = 0;
      while( true ) {
        if (local_4208 <= local_4980) {
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                     (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                     (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4b9c,DT_REQUIRE);
          local_4b9d = tf::MPMC<int_*,_10UL>::empty(in_stack_ffffffffffffb238);
          this = doctest::detail::ExpressionDecomposer::operator<<
                           ((ExpressionDecomposer *)
                            CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                            (bool *)in_stack_ffffffffffffb208);
          local_4b9e = 1;
          local_4b98 = this;
          doctest::detail::Expression_lhs<bool_const>::operator==
                    ((Expression_lhs<const_bool> *)this,
                     (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
          doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
          doctest::detail::Result::~Result((Result *)0x1bf9fc);
          doctest::detail::ResultBuilder::log(&local_4b70,__x_11);
          if ((extraout_AL_11 & 1) != 0) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          bVar5 = extraout_AL_11;
          doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
          doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bfad5);
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                     (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                     (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4c4c,DT_REQUIRE);
          tf::MPMC<int_*,_10UL>::try_dequeue(this_00);
          EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(int **)pRVar4);
          local_4c48 = EVar3.lhs;
          local_4c40 = EVar3.m_at;
          doctest::detail::Expression_lhs<int*const>::operator==
                    ((Expression_lhs<int_*const> *)this,
                     (void **)CONCAT17(bVar5,in_stack_ffffffffffffb288));
          doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
          doctest::detail::Result::~Result((Result *)0x1bfbed);
          doctest::detail::ResultBuilder::log(&local_4c18,__x_12);
          if ((extraout_AL_12 & 1) == 0) {
            doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
            doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bfccc);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffb218);
            return;
          }
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                   (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                   (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4a24,DT_REQUIRE);
        local_4a25 = tf::MPMC<int_*,_10UL>::empty(in_stack_ffffffffffffb238);
        local_4a20 = doctest::detail::ExpressionDecomposer::operator<<
                               ((ExpressionDecomposer *)
                                CONCAT44(in_stack_ffffffffffffb214,in_stack_ffffffffffffb210),
                                (bool *)in_stack_ffffffffffffb208);
        local_4a26 = 0;
        doctest::detail::Expression_lhs<bool_const>::operator==
                  ((Expression_lhs<const_bool> *)in_stack_ffffffffffffb290,
                   (bool *)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
        doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
        doctest::detail::Result::~Result((Result *)0x1bf5de);
        doctest::detail::ResultBuilder::log(&local_49f8,__x_09);
        if ((extraout_AL_09 & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bf6c9);
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_ffffffffffffb228,in_stack_ffffffffffffb224,
                   (char *)in_stack_ffffffffffffb218,in_stack_ffffffffffffb214,
                   (char *)in_stack_ffffffffffffb208,"",(char *)in_stack_ffffffffffffb238);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4ad4,DT_REQUIRE);
        local_4ae0 = tf::MPMC<int_*,_10UL>::try_dequeue(this_00);
        EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)in_stack_ffffffffffffb208,(int **)pRVar4);
        local_4af0 = EVar3.lhs;
        local_4ae8 = EVar3.m_at;
        local_4ad0 = local_4af0;
        local_4ac8 = local_4ae8;
        local_4af8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_4221 + 1),local_4980);
        doctest::detail::Expression_lhs<int*const>::operator==
                  (in_stack_ffffffffffffb290,
                   (int **)CONCAT17(in_stack_ffffffffffffb28f,in_stack_ffffffffffffb288));
        doctest::detail::ResultBuilder::setResult(in_stack_ffffffffffffb208,pRVar4);
        doctest::detail::Result::~Result((Result *)0x1bf7fe);
        doctest::detail::ResultBuilder::log(&local_4aa0,__x_10);
        if ((extraout_AL_10 & 1) != 0) break;
        doctest::detail::ResultBuilder::react(in_stack_ffffffffffffb208);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bf8e3);
        local_4980 = local_4980 + 1;
      }
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}